

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  wchar_t *pwVar1;
  
  pwVar1 = internal::
           format_decimal<wchar_t,unsigned_int,wchar_t*,fmt::v5::internal::no_thousands_sep>
                     (*it,*(undefined4 *)this,*(undefined4 *)(this + 4));
  *it = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }